

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O0

bool __thiscall sf::Shader::loadFromStream(Shader *this,InputStream *stream,Type type)

{
  bool bVar1;
  ostream *poVar2;
  int in_EDX;
  vector<char,_std::allocator<char>_> shader;
  char *in_stack_00001090;
  char *in_stack_00001098;
  char *in_stack_000010a0;
  Shader *in_stack_000010a8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  InputStream *in_stack_ffffffffffffff80;
  vector<char,_std::allocator<char>_> local_38;
  int local_1c;
  bool local_1;
  
  local_1c = in_EDX;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x15bb7a);
  bVar1 = anon_unknown.dwarf_79ada::getStreamContents
                    (in_stack_ffffffffffffff80,
                     (vector<char,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if (bVar1) {
    if (local_1c == 0) {
      std::vector<char,_std::allocator<char>_>::operator[](&local_38,0);
      local_1 = compile(in_stack_000010a8,in_stack_000010a0,in_stack_00001098,in_stack_00001090);
    }
    else if (local_1c == 1) {
      in_stack_ffffffffffffff70 = (vector<char,_std::allocator<char>_> *)0x0;
      std::vector<char,_std::allocator<char>_>::operator[](&local_38,0);
      local_1 = compile(in_stack_000010a8,in_stack_000010a0,in_stack_00001098,in_stack_00001090);
    }
    else {
      std::vector<char,_std::allocator<char>_>::operator[](&local_38,0);
      local_1 = compile(in_stack_000010a8,in_stack_000010a0,in_stack_00001098,in_stack_00001090);
    }
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to read shader from stream");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  std::vector<char,_std::allocator<char>_>::~vector(in_stack_ffffffffffffff70);
  return (bool)(local_1 & 1);
}

Assistant:

bool Shader::loadFromStream(InputStream& stream, Type type)
{
    // Read the shader code from the stream
    std::vector<char> shader;
    if (!getStreamContents(stream, shader))
    {
        err() << "Failed to read shader from stream" << std::endl;
        return false;
    }

    // Compile the shader program
    if (type == Vertex)
        return compile(&shader[0], NULL, NULL);
    else if (type == Geometry)
        return compile(NULL, &shader[0], NULL);
    else
        return compile(NULL, NULL, &shader[0]);
}